

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkStopReverseLevels(Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk->vLevelsR != (Vec_Int_t *)0x0) {
    Vec_IntFree(pNtk->vLevelsR);
    pNtk->vLevelsR = (Vec_Int_t *)0x0;
    pNtk->LevelMax = 0;
    return;
  }
  __assert_fail("pNtk->vLevelsR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                ,0x4ee,"void Abc_NtkStopReverseLevels(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkStopReverseLevels( Abc_Ntk_t * pNtk )
{
    assert( pNtk->vLevelsR );
    Vec_IntFree( pNtk->vLevelsR );
    pNtk->vLevelsR = NULL;
    pNtk->LevelMax = 0;

}